

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O0

pic_buf_t * ihevc_dpb_mgr_get_ref_by_nearest_poc(dpb_mgr_t *ps_dpb_mgr,WORD32 cur_abs_poc)

{
  int iVar1;
  int local_30;
  int local_2c;
  WORD32 poc_diff_1;
  WORD32 poc_diff;
  pic_buf_t *ps_pic_buf;
  WORD32 min_diff;
  WORD32 i;
  WORD32 cur_abs_poc_local;
  dpb_mgr_t *ps_dpb_mgr_local;
  
  min_diff = 0x7fffffff;
  ps_pic_buf = (pic_buf_t *)0x0;
  for (i = 0; i < 0x40; i = i + 1) {
    if ((((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf != (pic_buf_t *)0x0) &&
         ((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf)->u1_used_as_ref != '\0')) &&
        (iVar1 = cur_abs_poc - (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf)->i4_abs_poc, 0 < iVar1)) &&
       (iVar1 < min_diff)) {
      ps_pic_buf = ps_dpb_mgr->as_dpb_info[i].ps_pic_buf;
      min_diff = iVar1;
    }
  }
  if (ps_pic_buf == (pic_buf_t *)0x0) {
    min_diff = 0x7fffffff;
    for (i = 0; i < 0x40; i = i + 1) {
      if ((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf != (pic_buf_t *)0x0) &&
         ((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf)->u1_used_as_ref != '\0')) {
        local_30 = cur_abs_poc - (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf)->i4_abs_poc;
        local_2c = local_30;
        if (local_30 < 1) {
          local_2c = -local_30;
        }
        if (local_2c < min_diff) {
          if (local_30 < 1) {
            local_30 = -local_30;
          }
          min_diff = local_30;
          ps_pic_buf = ps_dpb_mgr->as_dpb_info[i].ps_pic_buf;
        }
      }
    }
  }
  return ps_pic_buf;
}

Assistant:

pic_buf_t* ihevc_dpb_mgr_get_ref_by_nearest_poc(dpb_mgr_t *ps_dpb_mgr, WORD32 cur_abs_poc)
{
    WORD32 i;
    WORD32 min_diff = 0x7FFFFFFF;
    pic_buf_t *ps_pic_buf = NULL;

    for(i = 0; i < MAX_DPB_BUFS; i++)
    {
        if((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf) &&
                        (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->u1_used_as_ref != UNUSED_FOR_REF))
        {
            WORD32 poc_diff = cur_abs_poc - ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->i4_abs_poc;
            if((poc_diff > 0) && (poc_diff < min_diff))
            {
                min_diff = poc_diff;
                ps_pic_buf = ps_dpb_mgr->as_dpb_info[i].ps_pic_buf;
            }
        }
    }

    if(NULL == ps_pic_buf)
    {
        min_diff = 0x7FFFFFFF;
        for(i = 0; i < MAX_DPB_BUFS; i++)
        {
            if((ps_dpb_mgr->as_dpb_info[i].ps_pic_buf) &&
                            (ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->u1_used_as_ref != UNUSED_FOR_REF))
            {
                WORD32 poc_diff = cur_abs_poc - ps_dpb_mgr->as_dpb_info[i].ps_pic_buf->i4_abs_poc;
                if(ABS(poc_diff) < min_diff)
                {
                    min_diff = ABS(poc_diff);
                    ps_pic_buf = ps_dpb_mgr->as_dpb_info[i].ps_pic_buf;
                }
            }
        }
    }

    return ps_pic_buf;
}